

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O1

Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> __thiscall
capnp::_::anon_unknown_0::TestNetworkAdapter::ConnectionImpl::receiveIncomingMessage
          (ConnectionImpl *this)

{
  int *piVar1;
  undefined8 *puVar2;
  _func_int **pp_Var3;
  long *plVar4;
  ImmediatePromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *extraout_RDX;
  ImmediatePromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *pIVar5;
  ImmediatePromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *extraout_RDX_00;
  ImmediatePromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *extraout_RDX_01;
  ImmediatePromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *extraout_RDX_02;
  long in_RSI;
  IncomingRpcMessage *pIVar6;
  Own<kj::_::ImmediatePromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_> OVar7;
  Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> PVar8;
  PromiseFulfillerPair<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> paf;
  Maybe<kj::Own<capnp::IncomingRpcMessage>_> local_1b8;
  Maybe<kj::Own<capnp::IncomingRpcMessage>_> local_1a8;
  _func_int **local_198;
  _func_int **pp_Stack_190;
  Disposer *local_188;
  IncomingRpcMessage *pIStack_180;
  undefined1 local_178 [24];
  long *local_160;
  
  if (*(char *)(in_RSI + 0x38) == '\x01') {
    kj::Exception::Exception((Exception *)local_178,(Exception *)(in_RSI + 0x40));
    kj::heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>
              ((kj *)&local_198,(Exception *)local_178);
    pp_Var3 = pp_Stack_190;
    pp_Stack_190 = (_func_int **)0x0;
    (this->super_Connection).super_Connection._vptr_Connection = local_198;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = pp_Var3;
    kj::Exception::~Exception((Exception *)local_178);
    pIVar5 = extraout_RDX;
  }
  else {
    puVar2 = *(undefined8 **)(in_RSI + 0x1f8);
    if (*(undefined8 **)(in_RSI + 0x218) == puVar2) {
      if (*(long *)(in_RSI + 0x240) == 0) {
        kj::newPromiseAndFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>();
        std::
        deque<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>>,std::allocator<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>>>>
        ::emplace_back<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>>>
                  ((deque<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>>,std::allocator<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>>>>
                    *)(in_RSI + 0x198),
                   (Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_> *)
                   (local_178 + 0x10));
        plVar4 = local_160;
        (this->super_Connection).super_Connection._vptr_Connection = (_func_int **)local_178._0_8_;
        (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_178._8_8_;
        local_178._8_8_ = (IncomingRpcMessage *)0x0;
        pIVar5 = extraout_RDX_00;
        if (local_160 != (long *)0x0) {
          local_160 = (long *)0x0;
          (***(_func_int ***)local_178._16_8_)
                    (local_178._16_8_,*(long *)(*plVar4 + -0x10) + (long)plVar4);
          pIVar5 = extraout_RDX_01;
        }
        pIVar6 = (IncomingRpcMessage *)local_178._8_8_;
        if ((IncomingRpcMessage *)local_178._8_8_ == (IncomingRpcMessage *)0x0) goto LAB_002e70f0;
      }
      else {
        (**(code **)**(undefined8 **)(in_RSI + 0x240))(*(undefined8 **)(in_RSI + 0x240),local_178);
        local_1b8.ptr.disposer = (Disposer *)0x0;
        local_1b8.ptr.ptr = (IncomingRpcMessage *)0x0;
        OVar7 = kj::
                heap<kj::_::ImmediatePromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>,kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>
                          ((kj *)local_178,&local_1b8);
        pIVar6 = local_1b8.ptr.ptr;
        pIVar5 = OVar7.ptr;
        (this->super_Connection).super_Connection._vptr_Connection = (_func_int **)local_178._0_8_;
        (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_178._8_8_;
        if (local_1b8.ptr.ptr == (IncomingRpcMessage *)0x0) goto LAB_002e70f0;
        local_1b8.ptr.ptr = (IncomingRpcMessage *)0x0;
        local_178._0_8_ = local_1b8.ptr.disposer;
      }
    }
    else {
      piVar1 = (int *)(*(long *)(in_RSI + 0x20) + 0x14);
      *piVar1 = *piVar1 + 1;
      local_188 = (Disposer *)*puVar2;
      pIStack_180 = (IncomingRpcMessage *)puVar2[1];
      puVar2[1] = 0;
      std::
      deque<kj::Own<capnp::IncomingRpcMessage>,_std::allocator<kj::Own<capnp::IncomingRpcMessage>_>_>
      ::pop_front((deque<kj::Own<capnp::IncomingRpcMessage>,_std::allocator<kj::Own<capnp::IncomingRpcMessage>_>_>
                   *)(in_RSI + 0x1e8));
      local_1a8.ptr.disposer = local_188;
      local_1a8.ptr.ptr = pIStack_180;
      OVar7 = kj::
              heap<kj::_::ImmediatePromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>,kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>
                        ((kj *)local_178,&local_1a8);
      pIVar6 = local_1a8.ptr.ptr;
      pIVar5 = OVar7.ptr;
      (this->super_Connection).super_Connection._vptr_Connection = (_func_int **)local_178._0_8_;
      (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_178._8_8_;
      if (local_1a8.ptr.ptr == (IncomingRpcMessage *)0x0) goto LAB_002e70f0;
      local_1a8.ptr.ptr = (IncomingRpcMessage *)0x0;
      local_178._0_8_ = local_1a8.ptr.disposer;
    }
    local_178._8_8_ = 0;
    (**((Disposer *)local_178._0_8_)->_vptr_Disposer)
              (local_178._0_8_,
               pIVar6->_vptr_IncomingRpcMessage[-2] + (long)&pIVar6->_vptr_IncomingRpcMessage);
    pIVar5 = extraout_RDX_02;
  }
LAB_002e70f0:
  PVar8.super_PromiseBase.node.ptr = (PromiseNode *)pIVar5;
  PVar8.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>)PVar8.super_PromiseBase.node;
}

Assistant:

kj::Promise<kj::Maybe<kj::Own<IncomingRpcMessage>>> receiveIncomingMessage() override {
      KJ_IF_MAYBE(e, networkException) {
        return kj::cp(*e);
      }

      if (messages.empty()) {
        KJ_IF_MAYBE(f, fulfillOnEnd) {
          f->get()->fulfill();
          return kj::Maybe<kj::Own<IncomingRpcMessage>>(nullptr);
        } else {
          auto paf = kj::newPromiseAndFulfiller<kj::Maybe<kj::Own<IncomingRpcMessage>>>();
          fulfillers.push(kj::mv(paf.fulfiller));
          return kj::mv(paf.promise);
        }
      }